

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O3

EFontStretch __thiscall FreeTypeFaceWrapper::StretchFromName(FreeTypeFaceWrapper *this)

{
  char *pcVar1;
  char *pcVar2;
  EFontStretch EVar3;
  
  if (this->mFace == (FT_Face)0x0) {
    EVar3 = eFontStretchUknown;
  }
  else {
    pcVar2 = this->mFace->style_name;
    if (pcVar2 == (char *)0x0) {
      EVar3 = eFontStretchNormal;
    }
    else {
      pcVar1 = strstr(pcVar2,"Semi Condensed");
      EVar3 = eFontStretchSemiCondensed;
      if (pcVar1 == (char *)0x0) {
        pcVar1 = strstr(pcVar2,"Ultra Condensed");
        EVar3 = eFontStretchUltraCondensed;
        if (pcVar1 == (char *)0x0) {
          pcVar1 = strstr(pcVar2,"Extra Compressed");
          if (pcVar1 == (char *)0x0) {
            pcVar1 = strstr(pcVar2,"Ultra Compressed");
            if (pcVar1 == (char *)0x0) {
              pcVar1 = strstr(pcVar2,"Extra Condensed");
              EVar3 = eFontStretchExtraCondensed;
              if (pcVar1 == (char *)0x0) {
                pcVar1 = strstr(pcVar2,"Compressed");
                if (pcVar1 == (char *)0x0) {
                  pcVar1 = strstr(pcVar2,"Condensed");
                  EVar3 = eFontStretchCondensed;
                  if (pcVar1 == (char *)0x0) {
                    pcVar1 = strstr(pcVar2,"Semi Expanded");
                    EVar3 = eFontStretchSemiExpanded;
                    if (pcVar1 == (char *)0x0) {
                      pcVar1 = strstr(pcVar2,"Extra Expanded");
                      EVar3 = eFontStretchExtraExpanded;
                      if (pcVar1 == (char *)0x0) {
                        pcVar1 = strstr(pcVar2,"Ultra Expanded");
                        EVar3 = eFontStretchUltraExpanded;
                        if (pcVar1 == (char *)0x0) {
                          pcVar2 = strstr(pcVar2,"Expanded");
                          EVar3 = (uint)(pcVar2 != (char *)0x0) * 2 + eFontStretchNormal;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return EVar3;
}

Assistant:

EFontStretch FreeTypeFaceWrapper::StretchFromName()
{
	if(mFace)
	{
		if(mFace->style_name)
		{
			if(strstr(mFace->style_name,"Semi Condensed") != NULL)
				return eFontStretchSemiCondensed;

			if(strstr(mFace->style_name,"Ultra Condensed") != NULL || strstr(mFace->style_name,"Extra Compressed") != NULL || strstr(mFace->style_name,"Ultra Compressed") != NULL)
				return eFontStretchUltraCondensed;

			if(strstr(mFace->style_name,"Extra Condensed") != NULL || strstr(mFace->style_name,"Compressed") != NULL)
				return eFontStretchExtraCondensed;

			if(strstr(mFace->style_name,"Condensed") != NULL)
				return eFontStretchCondensed;

			if(strstr(mFace->style_name,"Semi Expanded") != NULL)
				return eFontStretchSemiExpanded;

			if(strstr(mFace->style_name,"Extra Expanded") != NULL)
				return eFontStretchExtraExpanded;

			if(strstr(mFace->style_name,"Ultra Expanded") != NULL)
				return eFontStretchUltraExpanded;

			if(strstr(mFace->style_name,"Expanded") != NULL)
				return eFontStretchExpanded;

			return eFontStretchNormal;
		}
		else
			return eFontStretchNormal;
	}
	else
		return eFontStretchUknown;
}